

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O2

void sysbvm_tuple_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::type",(context->roots).anyValueType,"__type__",1,0x1c,(void *)0x0,
             sysbvm_tuple_primitive_getType);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::type:",(context->roots).anyValueType,"__type__:",2,4,(void *)0x0,
             sysbvm_tuple_primitive_setType);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::storedIdentityHash",(context->roots).anyValueType,
             "__storedIdentityHash__",1,4,(void *)0x0,sysbvm_tuple_primitive_storedIdentityHash);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::pointerIdentityHash",(context->roots).anyValueType,
             "__storedIdentityHash__",1,4,(void *)0x0,sysbvm_tuple_primitive_pointerIdentityHash);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::identityHash:",(context->roots).anyValueType,"__identityHash__:",2,4
             ,(void *)0x0,sysbvm_tuple_primitive_setIdentityHash);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::slotAt:",(context->roots).anyValueType,"__slotAt__:",2,4,(void *)0x0
             ,sysbvm_tuple_primitive_slotAt);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::slotAt:put:",(context->roots).anyValueType,"__slotAt__:put:",3,4,
             (void *)0x0,sysbvm_tuple_primitive_slotAtPut);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::uncheckedSlotAt:",(context->roots).anyValueType,
             "__uncheckedSlotAt__:",2,0x120014,(void *)0x0,sysbvm_tuple_primitive_uncheckedSlotAt);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::uncheckedSlotAt:put:",(context->roots).anyValueType,
             "__uncheckedSlotAt__:put:",3,0x120014,(void *)0x0,
             sysbvm_tuple_primitive_uncheckedSlotAtPut);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::byteSlotAt:",(context->roots).anyValueType,"__byteSlotAt__:",2,4,
             (void *)0x0,sysbvm_tuple_primitive_byteSlotAt);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::byteSlotAt:put:",(context->roots).anyValueType,"__byteSlotAt__:put:"
             ,3,4,(void *)0x0,sysbvm_tuple_primitive_byteSlotAtPut);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::uncheckedByteSlotAt:",(context->roots).anyValueType,
             "__uncheckedByteSlotAt__:",2,0x120014,(void *)0x0,
             sysbvm_tuple_primitive_uncheckedByteSlotAt);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::uncheckedByteSlotAt:put:",(context->roots).anyValueType,
             "__uncheckedByteSlotAt__:put:",3,0x120014,(void *)0x0,
             sysbvm_tuple_primitive_uncheckedByteSlotAtPut);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::refSlotAt:",(context->roots).anyValueType,"__refSlotAt__:",2,4,
             (void *)0x0,sysbvm_tuple_primitive_refSlotAt);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::refSlotAt:put:",(context->roots).anyValueType,"__refSlotAt__:put:",3
             ,4,(void *)0x0,sysbvm_tuple_primitive_refSlotAtPut);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::typeSlotAt:",(context->roots).anyValueType,"__typeSlotAt__:",2,
             0x80004,(void *)0x0,sysbvm_tuple_primitive_typeSlotAt);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::typeSlotAt:put:",(context->roots).anyValueType,"__typeSlotAt__:put:"
             ,3,0x80004,(void *)0x0,sysbvm_tuple_primitive_typeSlotAtPut);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::refTypeSlotAt:",(context->roots).anyValueType,"__refTypeSlotAt__:",2
             ,0x80004,(void *)0x0,sysbvm_tuple_primitive_refTypeSlotAt);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::refTypeSlotAt:put:",(context->roots).anyValueType,
             "__refTypeSlotAt__:put:",3,0x80004,(void *)0x0,sysbvm_tuple_primitive_refTypeSlotAtPut)
  ;
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"RawTuple::new",1,4,(void *)0x0,sysbvm_tuple_primitive_new);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"RawTuple::byteNew",1,4,(void *)0x0,sysbvm_tuple_primitive_byteNew);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,
             "RawTuple::basicAllocateWithType:instanceSize:alignment:slotCount:variableSize:isBytes:isWeak:"
             ,7,4,(void *)0x0,
             sysbvm_tuple_primitive_basicAllocateWithTypeInstanceSizeAlignmentSlotCountIsBytesIsWeak
            );
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::isBytes",(context->roots).anyValueType,"__isBytes__",1,0x1c,
             (void *)0x0,sysbvm_tuple_primitive_isBytes);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::isDummyValue",(context->roots).anyValueType,"__isDummyValue__",1,
             0x1c,(void *)0x0,sysbvm_tuple_primitive_isDummyValue);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::isWeak",(context->roots).anyValueType,"__isWeak__",1,0x1c,
             (void *)0x0,sysbvm_tuple_primitive_isWeak);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::size",(context->roots).anyValueType,"__size__",1,0x1c,(void *)0x0,
             sysbvm_tuple_primitive_size);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::uncheckedPointersSize",(context->roots).anyValueType,
             "__uncheckedPointersSize__",1,0x12001c,(void *)0x0,
             sysbvm_tuple_primitive_uncheckedPointersSize);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::byteSize",(context->roots).anyValueType,"__byteSize__",1,0x12001c,
             (void *)0x0,sysbvm_tuple_primitive_byteSize);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::shallowCopy",(context->roots).anyValueType,"__shallowCopy__",1,0x14,
             (void *)0x0,sysbvm_tuple_primitive_shallowCopy);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::markWeak",(context->roots).anyValueType,"__markWeak__",1,0x14,
             (void *)0x0,sysbvm_tuple_primitive_markWeak);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"RawTuple::markDummyValue",(context->roots).anyValueType,"__markDummyValue__",1
             ,0x14,(void *)0x0,sysbvm_tuple_primitive_markDummyValue);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"RawTuple::firstInstanceWithType",1,4,(void *)0x0,
             sysbvm_tuple_primitive_firstInstanceWithType);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"RawTuple::nextInstanceWithSameType",1,4,(void *)0x0,
             sysbvm_tuple_primitive_nextInstanceWithSameType);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"RawTuple::firstInstance",0,4,(void *)0x0,sysbvm_tuple_primitive_firstInstance)
  ;
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"RawTuple::nextInstance",1,4,(void *)0x0,sysbvm_tuple_primitive_nextInstance);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"recordBindingWithOwner:andName:",3,0x20,
             (void *)0x0,sysbvm_tuple_primitive_recordBindingWithOwnerAndName);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"ObjectModel::isLogical",0,4,(void *)0x0,
             sysbvm_tuple_primitive_objectModel_isLogical);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"ObjectModel::isNative",0,4,(void *)0x0,
             sysbvm_tuple_primitive_objectModel_isNative);
  return;
}

Assistant:

void sysbvm_tuple_setupPrimitives(sysbvm_context_t *context)
{
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::type", context->roots.anyValueType, "__type__", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_tuple_primitive_getType);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::type:", context->roots.anyValueType, "__type__:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_setType);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::storedIdentityHash", context->roots.anyValueType, "__storedIdentityHash__", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_storedIdentityHash);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::pointerIdentityHash", context->roots.anyValueType, "__storedIdentityHash__", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_pointerIdentityHash);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::identityHash:", context->roots.anyValueType, "__identityHash__:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_setIdentityHash);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::slotAt:", context->roots.anyValueType, "__slotAt__:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_slotAt);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::slotAt:put:", context->roots.anyValueType, "__slotAt__:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_slotAtPut);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::uncheckedSlotAt:", context->roots.anyValueType, "__uncheckedSlotAt__:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL | SYSBVM_FUNCTION_FLAGS_ALWAYS_INLINE | SYSBVM_FUNCTION_FLAGS_WITHOUT_SOURCE_DEBUGGING, NULL, sysbvm_tuple_primitive_uncheckedSlotAt);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::uncheckedSlotAt:put:", context->roots.anyValueType, "__uncheckedSlotAt__:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL | SYSBVM_FUNCTION_FLAGS_ALWAYS_INLINE | SYSBVM_FUNCTION_FLAGS_WITHOUT_SOURCE_DEBUGGING, NULL, sysbvm_tuple_primitive_uncheckedSlotAtPut);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::byteSlotAt:", context->roots.anyValueType, "__byteSlotAt__:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_byteSlotAt);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::byteSlotAt:put:", context->roots.anyValueType, "__byteSlotAt__:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_byteSlotAtPut);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::uncheckedByteSlotAt:", context->roots.anyValueType, "__uncheckedByteSlotAt__:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL | SYSBVM_FUNCTION_FLAGS_ALWAYS_INLINE | SYSBVM_FUNCTION_FLAGS_WITHOUT_SOURCE_DEBUGGING, NULL, sysbvm_tuple_primitive_uncheckedByteSlotAt);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::uncheckedByteSlotAt:put:", context->roots.anyValueType, "__uncheckedByteSlotAt__:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL | SYSBVM_FUNCTION_FLAGS_ALWAYS_INLINE | SYSBVM_FUNCTION_FLAGS_WITHOUT_SOURCE_DEBUGGING, NULL, sysbvm_tuple_primitive_uncheckedByteSlotAtPut);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::refSlotAt:", context->roots.anyValueType, "__refSlotAt__:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_refSlotAt);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::refSlotAt:put:", context->roots.anyValueType, "__refSlotAt__:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_refSlotAtPut);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::typeSlotAt:", context->roots.anyValueType, "__typeSlotAt__:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_TARGET_DEFINED_PRIMITIVE, NULL, sysbvm_tuple_primitive_typeSlotAt);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::typeSlotAt:put:", context->roots.anyValueType, "__typeSlotAt__:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_TARGET_DEFINED_PRIMITIVE, NULL, sysbvm_tuple_primitive_typeSlotAtPut);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::refTypeSlotAt:", context->roots.anyValueType, "__refTypeSlotAt__:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_TARGET_DEFINED_PRIMITIVE, NULL, sysbvm_tuple_primitive_refTypeSlotAt);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::refTypeSlotAt:put:", context->roots.anyValueType, "__refTypeSlotAt__:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_TARGET_DEFINED_PRIMITIVE, NULL, sysbvm_tuple_primitive_refTypeSlotAtPut);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "RawTuple::new", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_new);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "RawTuple::byteNew", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_byteNew);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "RawTuple::basicAllocateWithType:instanceSize:alignment:slotCount:variableSize:isBytes:isWeak:", 7, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_basicAllocateWithTypeInstanceSizeAlignmentSlotCountIsBytesIsWeak);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::isBytes", context->roots.anyValueType, "__isBytes__", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_tuple_primitive_isBytes);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::isDummyValue", context->roots.anyValueType, "__isDummyValue__", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_tuple_primitive_isDummyValue);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::isWeak", context->roots.anyValueType, "__isWeak__", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_tuple_primitive_isWeak);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::size", context->roots.anyValueType, "__size__", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_tuple_primitive_size);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::uncheckedPointersSize", context->roots.anyValueType, "__uncheckedPointersSize__", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL | SYSBVM_FUNCTION_FLAGS_ALWAYS_INLINE | SYSBVM_FUNCTION_FLAGS_WITHOUT_SOURCE_DEBUGGING, NULL, sysbvm_tuple_primitive_uncheckedPointersSize);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::byteSize", context->roots.anyValueType, "__byteSize__", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL | SYSBVM_FUNCTION_FLAGS_ALWAYS_INLINE | SYSBVM_FUNCTION_FLAGS_WITHOUT_SOURCE_DEBUGGING, NULL, sysbvm_tuple_primitive_byteSize);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::shallowCopy", context->roots.anyValueType, "__shallowCopy__", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_tuple_primitive_shallowCopy);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::markWeak", context->roots.anyValueType, "__markWeak__", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_tuple_primitive_markWeak);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "RawTuple::markDummyValue", context->roots.anyValueType, "__markDummyValue__", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_tuple_primitive_markDummyValue);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "RawTuple::firstInstanceWithType", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_firstInstanceWithType);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "RawTuple::nextInstanceWithSameType", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_nextInstanceWithSameType);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "RawTuple::firstInstance", 0, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_firstInstance);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "RawTuple::nextInstance", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_nextInstance);

    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "recordBindingWithOwner:andName:", 3, SYSBVM_FUNCTION_FLAGS_VIRTUAL, NULL, sysbvm_tuple_primitive_recordBindingWithOwnerAndName);

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "ObjectModel::isLogical", 0, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_objectModel_isLogical);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "ObjectModel::isNative", 0, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_tuple_primitive_objectModel_isNative);
}